

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cc
# Opt level: O1

int OBJ_obj2txt(char *buf,int buf_len,ASN1_OBJECT *a,int no_name)

{
  int iVar1;
  ASN1_OBJECT *pAVar2;
  char *src;
  int unaff_EBP;
  char **src_00;
  bool bVar3;
  CBS cbs;
  CBS local_38;
  
  if ((a == (ASN1_OBJECT *)0x0) || (a->length == 0)) {
    iVar1 = strlcpy_int(buf,"",buf_len);
    return iVar1;
  }
  if (no_name == 0) {
    iVar1 = OBJ_obj2nid(a);
    if (iVar1 == 0) {
      bVar3 = true;
    }
    else {
      pAVar2 = OBJ_nid2obj(iVar1);
      if (pAVar2 == (ASN1_OBJECT *)0x0) {
        src_00 = (char **)0x0;
      }
      else {
        src_00 = pAVar2->ln;
      }
      if (src_00 == (char **)0x0) {
        pAVar2 = OBJ_nid2obj(iVar1);
        if (pAVar2 == (ASN1_OBJECT *)0x0) {
          src_00 = (char **)0x0;
        }
        else {
          src_00 = (char **)pAVar2->sn;
        }
      }
      bVar3 = src_00 == (char **)0x0;
      unaff_EBP = iVar1;
      if (!bVar3) {
        unaff_EBP = strlcpy_int(buf,(char *)src_00,buf_len);
      }
    }
    if (!bVar3) {
      return unaff_EBP;
    }
  }
  local_38.data = a->data;
  local_38.len = (size_t)a->length;
  src = CBS_asn1_oid_to_text(&local_38);
  if (src == (char *)0x0) {
    iVar1 = -1;
    if (0 < buf_len) {
      *buf = '\0';
    }
  }
  else {
    iVar1 = strlcpy_int(buf,src,buf_len);
    OPENSSL_free(src);
  }
  return iVar1;
}

Assistant:

int OBJ_obj2txt(char *out, int out_len, const ASN1_OBJECT *obj,
                int always_return_oid) {
  // Python depends on the empty OID successfully encoding as the empty
  // string.
  if (obj == NULL || obj->length == 0) {
    return strlcpy_int(out, "", out_len);
  }

  if (!always_return_oid) {
    int nid = OBJ_obj2nid(obj);
    if (nid != NID_undef) {
      const char *name = OBJ_nid2ln(nid);
      if (name == NULL) {
        name = OBJ_nid2sn(nid);
      }
      if (name != NULL) {
        return strlcpy_int(out, name, out_len);
      }
    }
  }

  CBS cbs;
  CBS_init(&cbs, obj->data, obj->length);
  char *txt = CBS_asn1_oid_to_text(&cbs);
  if (txt == NULL) {
    if (out_len > 0) {
      out[0] = '\0';
    }
    return -1;
  }

  int ret = strlcpy_int(out, txt, out_len);
  OPENSSL_free(txt);
  return ret;
}